

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.h
# Opt level: O3

void __thiscall
spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass
          (RegionRegisterLiveness *this,RegisterClass *reg_class)

{
  __normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_*,_std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>_>
  _Var1;
  unsigned_long local_18;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>*,std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>,std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass(spvtools::opt::RegisterLiveness::RegisterClass_const&)::_lambda(std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>const&)_1_>>
                    ((this->registers_classes_).
                     super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->registers_classes_).
                     super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,reg_class);
  if (_Var1._M_current ==
      (this->registers_classes_).
      super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_18 = 1;
    std::
    vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>,std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>>>
    ::emplace_back<spvtools::opt::RegisterLiveness::RegisterClass_const,unsigned_long>
              ((vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>,std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>>>
                *)&this->registers_classes_,reg_class,&local_18);
  }
  else {
    (_Var1._M_current)->second = (_Var1._M_current)->second + 1;
  }
  return;
}

Assistant:

void AddRegisterClass(const RegisterClass& reg_class) {
      auto it = std::find_if(
          registers_classes_.begin(), registers_classes_.end(),
          [&reg_class](const std::pair<RegisterClass, size_t>& class_count) {
            return class_count.first == reg_class;
          });
      if (it != registers_classes_.end()) {
        it->second++;
      } else {
        registers_classes_.emplace_back(std::move(reg_class),
                                        static_cast<size_t>(1));
      }
    }